

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ToString.hpp
# Opt level: O3

string * __thiscall
ut11::utility::ParseToString<std::shared_ptr<int>>::operator()[abi_cxx11_
          (string *__return_storage_ptr__,void *this,shared_ptr<int> *value)

{
  size_type *psVar1;
  int *piVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  ulong uVar5;
  ulong *local_1e0;
  long local_1d8;
  ulong local_1d0 [2];
  ulong *local_1c0;
  long local_1b8;
  ulong local_1b0 [2];
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  if ((value->super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>)._M_ptr == (element_type *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"nullptr","");
    return __return_storage_ptr__;
  }
  local_1c0 = local_1b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"shared_ptr:","");
  piVar2 = (value->super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::ostream::operator<<(local_190,*piVar2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  uVar5 = 0xf;
  if (local_1c0 != local_1b0) {
    uVar5 = local_1b0[0];
  }
  if (uVar5 < (ulong)(local_1d8 + local_1b8)) {
    uVar5 = 0xf;
    if (local_1e0 != local_1d0) {
      uVar5 = local_1d0[0];
    }
    if ((ulong)(local_1d8 + local_1b8) <= uVar5) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1e0,0,(char *)0x0,(ulong)local_1c0);
      goto LAB_00211e7e;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1c0,(ulong)local_1e0);
LAB_00211e7e:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar4 + 2;
  if ((size_type *)*puVar4 == psVar1) {
    uVar3 = puVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_1e0 != local_1d0) {
    operator_delete(local_1e0);
  }
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string operator()(const std::shared_ptr<T>& value) const
			{
				return value ? std::string("shared_ptr:") + ParseToString<T>()(*value) : "nullptr";
			}